

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e7fc::TestBuildSystemFrontendDelegate::commandProcessStarted
          (TestBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle)

{
  raw_ostream *prVar1;
  StringRef Str;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  Command *command_local;
  TestBuildSystemFrontendDelegate *this_local;
  ProcessHandle handle_local;
  
  lock._M_device = (mutex_type *)command;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->traceMutex);
  this->currentlyRunningTasks = this->currentlyRunningTasks + 1;
  if (this->maxRunningTasks < this->currentlyRunningTasks) {
    this->maxRunningTasks = this->currentlyRunningTasks;
  }
  prVar1 = llvm::raw_ostream::operator<<
                     (&(this->traceStream).super_raw_ostream,"commandProcessStarted");
  prVar1 = llvm::raw_ostream::operator<<(prVar1,": ");
  Str = llbuild::buildsystem::Command::getName((Command *)lock._M_device);
  prVar1 = llvm::raw_ostream::operator<<(prVar1,Str);
  llvm::raw_ostream::operator<<(prVar1,"\n");
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessStarted
            (&this->super_BuildSystemFrontendDelegate,(Command *)lock._M_device,handle);
  return;
}

Assistant:

virtual void commandProcessStarted(Command* command, ProcessHandle handle) override {
    {
      std::lock_guard<std::mutex> lock(traceMutex);

      // Keep track of max build parallelism
      currentlyRunningTasks++;
      if (currentlyRunningTasks > maxRunningTasks)
        maxRunningTasks = currentlyRunningTasks;

      traceStream << __func__ << ": " << command->getName() << "\n";
    }
    super::commandProcessStarted(command, handle);
  }